

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O0

int __thiscall ncnn::Convolution::create_pipeline(Convolution *this,Option *opt)

{
  float fVar1;
  bool bVar2;
  float *pfVar3;
  Layer *pLVar4;
  reference ppLVar5;
  undefined8 *in_RSI;
  long in_RDI;
  Mat weights [1];
  ParamDict pd_2;
  float top_rescale;
  int n_1;
  ParamDict pd_1;
  Mat int8_weight_data_n;
  Mat weight_data_n;
  Option opt_q;
  ParamDict pd;
  Layer *op;
  int n;
  int weight_data_size_output;
  Mat int8_weight_data;
  bool weight_data_is_float32;
  bool weight_data_is_int8;
  Mat *in_stack_ffffffffffffe278;
  int in_stack_ffffffffffffe280;
  int in_stack_ffffffffffffe284;
  undefined4 in_stack_ffffffffffffe288;
  int in_stack_ffffffffffffe28c;
  Mat *in_stack_ffffffffffffe290;
  size_type in_stack_ffffffffffffe298;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *in_stack_ffffffffffffe2a0;
  Mat *local_1d48;
  value_type in_stack_ffffffffffffe2c0;
  Mat *local_1d20;
  bool local_1cd3;
  bool local_1cd2;
  bool local_1cd1;
  undefined1 local_1cc8 [80];
  Mat local_1c78;
  undefined1 auStack_1c38 [2312];
  float local_1330;
  int local_132c;
  ParamDict local_1328;
  undefined1 local_a28 [64];
  undefined1 local_9e8 [64];
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  ParamDict local_980;
  Layer *local_80;
  int local_78;
  int local_74;
  int local_70;
  undefined8 local_40;
  undefined1 local_1a;
  undefined1 local_19;
  undefined8 *local_18;
  int local_4;
  
  local_19 = *(long *)(in_RDI + 0x110) == 1;
  local_1a = *(long *)(in_RDI + 0x110) == 4;
  if (((bool)local_19) && ((*(byte *)((long)in_RSI + 0x1a) & 1) == 0)) {
    fprintf(_stderr,"quantized int8 weight loaded but use_int8_inference disabled\n");
    local_4 = -1;
  }
  else {
    local_1cd1 = false;
    if ((*(byte *)((long)in_RSI + 0x1a) & 1) != 0) {
      local_1cd2 = true;
      if (!(bool)local_19) {
        local_1cd3 = false;
        if ((bool)local_1a) {
          local_1cd3 = *(int *)(in_RDI + 0xb8) != 0;
        }
        local_1cd2 = local_1cd3;
      }
      local_1cd1 = local_1cd2;
    }
    *(bool *)(in_RDI + 0x1c8) = local_1cd1;
    local_18 = in_RSI;
    if (((bool)local_1a) && ((*(byte *)(in_RDI + 0x1c8) & 1) != 0)) {
      Mat::Mat(in_stack_ffffffffffffe290,in_stack_ffffffffffffe28c,
               CONCAT44(in_stack_ffffffffffffe284,in_stack_ffffffffffffe280),
               (Allocator *)in_stack_ffffffffffffe278);
      bVar2 = Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffe284,in_stack_ffffffffffffe280));
      if (bVar2) {
        local_4 = -100;
        local_70 = 1;
      }
      else {
        local_74 = *(int *)(in_RDI + 0xb4) / *(int *)(in_RDI + 0x80);
        for (local_78 = 0; local_78 < *(int *)(in_RDI + 0x80); local_78 = local_78 + 1) {
          local_80 = create_layer(in_stack_ffffffffffffe28c);
          ParamDict::ParamDict((ParamDict *)in_stack_ffffffffffffe2c0);
          pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0x180),local_78);
          ParamDict::set(&local_980,0,*pfVar3);
          (*local_80->_vptr_Layer[2])(local_80,&local_980);
          (*local_80->_vptr_Layer[4])(local_80,local_18);
          local_988 = local_18[4];
          local_9a8 = *local_18;
          local_998 = local_18[2];
          uStack_990 = local_18[3];
          uStack_9a0 = local_40;
          Mat::range((Mat *)CONCAT44(in_stack_ffffffffffffe28c,in_stack_ffffffffffffe288),
                     in_stack_ffffffffffffe284,in_stack_ffffffffffffe280);
          Mat::range((Mat *)CONCAT44(in_stack_ffffffffffffe28c,in_stack_ffffffffffffe288),
                     in_stack_ffffffffffffe284,in_stack_ffffffffffffe280);
          (*local_80->_vptr_Layer[7])(local_80,local_9e8,local_a28,&local_9a8);
          if (local_80 != (Layer *)0x0) {
            (*local_80->_vptr_Layer[1])();
          }
          Mat::~Mat((Mat *)0x13588f);
          Mat::~Mat((Mat *)0x13589c);
          ParamDict::~ParamDict((ParamDict *)in_stack_ffffffffffffe290);
        }
        Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffe28c,in_stack_ffffffffffffe288),
                       (Mat *)CONCAT44(in_stack_ffffffffffffe284,in_stack_ffffffffffffe280));
        local_70 = 0;
      }
      Mat::~Mat((Mat *)0x13595e);
      if (local_70 != 0) {
        return local_4;
      }
    }
    if ((*(byte *)(in_RDI + 0x1c8) & 1) != 0) {
      pLVar4 = create_layer(in_stack_ffffffffffffe28c);
      *(Layer **)(in_RDI + 0x1d0) = pLVar4;
      ParamDict::ParamDict((ParamDict *)in_stack_ffffffffffffe2c0);
      ParamDict::set(&local_1328,0,*(float *)(in_RDI + 0x1c0));
      (**(code **)(**(long **)(in_RDI + 0x1d0) + 0x10))(*(long **)(in_RDI + 0x1d0),&local_1328);
      (**(code **)(**(long **)(in_RDI + 0x1d0) + 0x20))(*(long **)(in_RDI + 0x1d0),local_18);
      ParamDict::~ParamDict((ParamDict *)in_stack_ffffffffffffe290);
      std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                (in_stack_ffffffffffffe2a0,in_stack_ffffffffffffe298);
      for (local_132c = 0; local_132c < *(int *)(in_RDI + 0x80); local_132c = local_132c + 1) {
        pLVar4 = create_layer(in_stack_ffffffffffffe28c);
        ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x1d8),(long)local_132c);
        *ppLVar5 = pLVar4;
        local_1330 = 1.0;
        pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0x180),local_132c);
        if ((*pfVar3 != 0.0) || (NAN(*pfVar3))) {
          fVar1 = *(float *)(in_RDI + 0x1c0);
          pfVar3 = Mat::operator[]((Mat *)(in_RDI + 0x180),local_132c);
          local_1330 = 1.0 / (fVar1 * *pfVar3);
        }
        else {
          local_1330 = 0.0;
        }
        ParamDict::ParamDict((ParamDict *)in_stack_ffffffffffffe2c0);
        ParamDict::set((ParamDict *)(auStack_1c38 + 8),0,local_1330);
        ParamDict::set((ParamDict *)(auStack_1c38 + 8),1,*(int *)(in_RDI + 0xb0));
        ParamDict::set((ParamDict *)(auStack_1c38 + 8),2,1);
        ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x1d8),(long)local_132c);
        (*(*ppLVar5)->_vptr_Layer[2])(*ppLVar5,auStack_1c38 + 8);
        ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x1d8),(long)local_132c);
        (*(*ppLVar5)->_vptr_Layer[4])(*ppLVar5,local_18);
        local_1d20 = &local_1c78;
        do {
          Mat::Mat(local_1d20);
          local_1d20 = local_1d20 + 1;
        } while (local_1d20 != (Mat *)auStack_1c38);
        Mat::range((Mat *)CONCAT44(in_stack_ffffffffffffe28c,in_stack_ffffffffffffe288),
                   in_stack_ffffffffffffe284,in_stack_ffffffffffffe280);
        Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffe28c,in_stack_ffffffffffffe288),
                       (Mat *)CONCAT44(in_stack_ffffffffffffe284,in_stack_ffffffffffffe280));
        Mat::~Mat((Mat *)0x135ccc);
        ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x1d8),(long)local_132c);
        in_stack_ffffffffffffe2c0 = *ppLVar5;
        ModelBinFromMatArray::ModelBinFromMatArray
                  ((ModelBinFromMatArray *)
                   CONCAT44(in_stack_ffffffffffffe284,in_stack_ffffffffffffe280),
                   in_stack_ffffffffffffe278);
        (*in_stack_ffffffffffffe2c0->_vptr_Layer[3])(in_stack_ffffffffffffe2c0,local_1cc8);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)0x135d2c);
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe290,
                   (value_type_conflict4 *)
                   CONCAT44(in_stack_ffffffffffffe28c,in_stack_ffffffffffffe288));
        local_1d48 = (Mat *)auStack_1c38;
        do {
          local_1d48 = local_1d48 + -1;
          Mat::~Mat((Mat *)0x135d73);
        } while (local_1d48 != &local_1c78);
        ParamDict::~ParamDict((ParamDict *)in_stack_ffffffffffffe290);
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Convolution::create_pipeline(const Option& opt)
{
    bool weight_data_is_int8 = (weight_data.elemsize == (size_t)1u);
    bool weight_data_is_float32 = (weight_data.elemsize == (size_t)4u);

    if (weight_data_is_int8 && !opt.use_int8_inference)
    {
        fprintf(stderr, "quantized int8 weight loaded but use_int8_inference disabled\n");
        return -1;
    }

    use_int8_inference = opt.use_int8_inference && (weight_data_is_int8 || (weight_data_is_float32 && int8_scale_term));

    // runtime quantize the weight data
    if (weight_data_is_float32 && use_int8_inference)
    {
        // quantize weight to int8
        Mat int8_weight_data(weight_data_size, (size_t)1u);
        if (int8_weight_data.empty())
            return -100;

        const int weight_data_size_output = weight_data_size / num_output;

        for (int n=0; n<num_output; n++)
        {
            Layer* op = ncnn::create_layer(ncnn::LayerType::Quantize);

            ncnn::ParamDict pd;
            pd.set(0, weight_data_int8_scales[n]);// scale

            op->load_param(pd);

            op->create_pipeline(opt);

            Option opt_q = opt;
            opt_q.blob_allocator = int8_weight_data.allocator;

            const Mat weight_data_n = weight_data.range(weight_data_size_output * n, weight_data_size_output);
            Mat int8_weight_data_n = int8_weight_data.range(weight_data_size_output * n, weight_data_size_output);
            op->forward(weight_data_n, int8_weight_data_n, opt_q);

            delete op;
        }

        weight_data = int8_weight_data;
    }

    // initial the quantize,dequantize op layer
    if (use_int8_inference)
    {
        quantize = ncnn::create_layer(ncnn::LayerType::Quantize);
        {
            ncnn::ParamDict pd;
            pd.set(0, bottom_blob_int8_scale);// scale

            quantize->load_param(pd);

            quantize->create_pipeline(opt);
        }

        dequantize_ops.resize(num_output);
        for (int n=0; n<num_output; n++)
        {
            dequantize_ops[n] = ncnn::create_layer(ncnn::LayerType::Dequantize);

            float top_rescale = 1.f;

            if (weight_data_int8_scales[n] == 0)
                top_rescale = 0;
            else
                top_rescale = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[n]);

            ncnn::ParamDict pd;
            pd.set(0, top_rescale);// scale
            pd.set(1, bias_term);  // bias_term
            pd.set(2, 1);          // bias_data_size

            dequantize_ops[n]->load_param(pd);

            dequantize_ops[n]->create_pipeline(opt);

            ncnn::Mat weights[1];
            weights[0] = bias_data.range(n, 1);

            dequantize_ops[n]->load_model(ModelBinFromMatArray(weights));

            dequantize_scales.push_back(top_rescale);
        }
    }

    return 0;
}